

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O2

void Bbl_ManVerify(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2)

{
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  
  pNtk = Abc_NtkStrash(pNtk1,0,1,0);
  pNtk_00 = Abc_NtkStrash(pNtk2,0,1,0);
  Abc_NtkShortNames(pNtk);
  Abc_NtkShortNames(pNtk_00);
  Abc_NtkCecFraig(pNtk,pNtk_00,0,0);
  Abc_NtkDelete(pNtk);
  Abc_NtkDelete(pNtk_00);
  return;
}

Assistant:

void Bbl_ManVerify( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2 )
{
    extern void Abc_NtkCecFraig( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose );
    Abc_Ntk_t * pAig1, * pAig2;
    pAig1 = Abc_NtkStrash( pNtk1, 0, 1, 0 );
    pAig2 = Abc_NtkStrash( pNtk2, 0, 1, 0 );
    Abc_NtkShortNames( pAig1 );
    Abc_NtkShortNames( pAig2 );
    Abc_NtkCecFraig( pAig1, pAig2, 0, 0 );
    Abc_NtkDelete( pAig1 );
    Abc_NtkDelete( pAig2 );
}